

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O0

_Bool chunk_list_remove(char *name)

{
  int iVar1;
  int local_20;
  int local_1c;
  wchar_t j;
  wchar_t i;
  char *name_local;
  
  local_1c = 0;
  while( true ) {
    if ((int)(uint)chunk_list_max <= local_1c) {
      return false;
    }
    iVar1 = strcmp(name,chunk_list[local_1c]->name);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  while (local_20 = local_1c + 1, local_20 < (int)(uint)chunk_list_max) {
    chunk_list[local_1c] = chunk_list[local_20];
    local_1c = local_20;
  }
  chunk_list_max = chunk_list_max - 1;
  chunk_list[chunk_list_max] = (chunk_conflict *)0x0;
  return true;
}

Assistant:

bool chunk_list_remove(const char *name)
{
	int i;

	/* Find the match */
	for (i = 0; i < chunk_list_max; i++) {
		if (streq(name, chunk_list[i]->name)) {
			/* Copy all the succeeding chunks back one */
			int j;
			for (j = i + 1; j < chunk_list_max; j++) {
				chunk_list[j - 1] = chunk_list[j];
			}

			/* Shorten the list and return */
			chunk_list_max--;
			chunk_list[chunk_list_max] = NULL;
			return true;
		}
	}

	return false;
}